

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

DecodeStatus Decode2OpInstructionFail(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint32_t uVar1;
  void *in_RCX;
  uint64_t in_RDX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint Opcode;
  DecodeStatus local_4;
  
  uVar1 = fieldFromInstruction_4(in_ESI,0xb,5);
  switch(uVar1) {
  case 0:
    MCInst_setOpcode(in_RDI,0xe6);
    local_4 = Decode2RUSInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
    break;
  case 1:
    MCInst_setOpcode(in_RDI,0xa3);
    local_4 = Decode2RUSInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
    break;
  case 2:
    MCInst_setOpcode(in_RDI,0x17);
    local_4 = Decode3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
    break;
  case 3:
    MCInst_setOpcode(in_RDI,0xe9);
    local_4 = Decode3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
    break;
  case 4:
    MCInst_setOpcode(in_RDI,0xd7);
    local_4 = Decode3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
    break;
  case 5:
    MCInst_setOpcode(in_RDI,0xd9);
    local_4 = Decode3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
    break;
  case 6:
    MCInst_setOpcode(in_RDI,0x56);
    local_4 = Decode3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
    break;
  case 7:
    MCInst_setOpcode(in_RDI,0x1b);
    local_4 = Decode3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
    break;
  case 8:
    MCInst_setOpcode(in_RDI,0xb2);
    local_4 = Decode3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
    break;
  case 9:
    MCInst_setOpcode(in_RDI,0xa4);
    local_4 = Decode3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
    break;
  default:
    local_4 = MCDisassembler_Fail;
    break;
  case 0x10:
    MCInst_setOpcode(in_RDI,0x7f);
    local_4 = Decode3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
    break;
  case 0x11:
    MCInst_setOpcode(in_RDI,0x80);
    local_4 = Decode3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
    break;
  case 0x12:
    MCInst_setOpcode(in_RDI,0x16);
    local_4 = Decode2RUSInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
    break;
  case 0x13:
    MCInst_setOpcode(in_RDI,0xe8);
    local_4 = Decode2RUSInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
    break;
  case 0x14:
    MCInst_setOpcode(in_RDI,0xd6);
    local_4 = Decode2RUSBitpInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
    break;
  case 0x15:
    MCInst_setOpcode(in_RDI,0xd8);
    local_4 = Decode2RUSBitpInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
    break;
  case 0x16:
    MCInst_setOpcode(in_RDI,0x55);
    local_4 = Decode2RUSInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
    break;
  case 0x17:
    MCInst_setOpcode(in_RDI,0xef);
    local_4 = Decode3RImmInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
    break;
  case 0x18:
    MCInst_setOpcode(in_RDI,0xa6);
    local_4 = Decode3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
    break;
  case 0x19:
    MCInst_setOpcode(in_RDI,0xa8);
    local_4 = Decode3RInstruction(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  return local_4;
}

Assistant:

static DecodeStatus Decode2OpInstructionFail(MCInst *Inst, unsigned Insn, uint64_t Address,
		const void *Decoder)
{
	// Try and decode as a 3R instruction.
	unsigned Opcode = fieldFromInstruction_4(Insn, 11, 5);
	switch (Opcode) {
		case 0x0:
			MCInst_setOpcode(Inst, XCore_STW_2rus);
			return Decode2RUSInstruction(Inst, Insn, Address, Decoder);
		case 0x1:
			MCInst_setOpcode(Inst, XCore_LDW_2rus);
			return Decode2RUSInstruction(Inst, Insn, Address, Decoder);
		case 0x2:
			MCInst_setOpcode(Inst, XCore_ADD_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x3:
			MCInst_setOpcode(Inst, XCore_SUB_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x4:
			MCInst_setOpcode(Inst, XCore_SHL_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x5:
			MCInst_setOpcode(Inst, XCore_SHR_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x6:
			MCInst_setOpcode(Inst, XCore_EQ_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x7:
			MCInst_setOpcode(Inst, XCore_AND_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x8:
			MCInst_setOpcode(Inst, XCore_OR_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x9:
			MCInst_setOpcode(Inst, XCore_LDW_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x10:
			MCInst_setOpcode(Inst, XCore_LD16S_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x11:
			MCInst_setOpcode(Inst, XCore_LD8U_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x12:
			MCInst_setOpcode(Inst, XCore_ADD_2rus);
			return Decode2RUSInstruction(Inst, Insn, Address, Decoder);
		case 0x13:
			MCInst_setOpcode(Inst, XCore_SUB_2rus);
			return Decode2RUSInstruction(Inst, Insn, Address, Decoder);
		case 0x14:
			MCInst_setOpcode(Inst, XCore_SHL_2rus);
			return Decode2RUSBitpInstruction(Inst, Insn, Address, Decoder);
		case 0x15:
			MCInst_setOpcode(Inst, XCore_SHR_2rus);
			return Decode2RUSBitpInstruction(Inst, Insn, Address, Decoder);
		case 0x16:
			MCInst_setOpcode(Inst, XCore_EQ_2rus);
			return Decode2RUSInstruction(Inst, Insn, Address, Decoder);
		case 0x17:
			MCInst_setOpcode(Inst, XCore_TSETR_3r);
			return Decode3RImmInstruction(Inst, Insn, Address, Decoder);
		case 0x18:
			MCInst_setOpcode(Inst, XCore_LSS_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x19:
			MCInst_setOpcode(Inst, XCore_LSU_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
	}

	return MCDisassembler_Fail;
}